

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_ConstrainExactAll(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  void **__ptr;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    pManMR->nExactConstraints = 0;
  }
  else {
    lVar4 = 0;
    do {
      if (pVVar3->pArray[lVar4] != (void *)0x0) {
        uVar1 = *(uint *)((long)pVVar3->pArray[lVar4] + 0x10);
        if (pManMR->vTimeEdges[uVar1].nSize != 0) {
          pVVar3 = pManMR->vTimeEdges + uVar1;
          __ptr = pVVar3->pArray;
          pVVar3->nCap = 0;
          pVVar3->nSize = 0;
          pVVar3->pArray = (void **)0x0;
          if (__ptr != (void **)0x0) {
            free(__ptr);
          }
        }
      }
      lVar4 = lVar4 + 1;
      pVVar3 = pNtk->vObjs;
      iVar2 = pVVar3->nSize;
    } while (lVar4 < iVar2);
    pManMR->nExactConstraints = 0;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar3->pArray[lVar4];
        if ((((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) &&
            ((undefined1  [24])
             ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x90) ==
             (undefined1  [24])0x80)) && (pManMR->vTimeEdges[(uint)pObj->Id].nSize == 0)) {
          Abc_FlowRetime_ConstrainExact(pObj);
          pVVar3 = pNtk->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar3->nSize);
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExactAll( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;
  void *pArray;
  
  // free existing constraints
  Abc_NtkForEachObj( pNtk, pObj, i )    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  pManMR->nExactConstraints = 0;
  
  // generate all constraints
  Abc_NtkForEachObj(pNtk, pObj, i)
    if (!Abc_ObjIsLatch(pObj) && FTEST( pObj, CONSERVATIVE ) && !FTEST( pObj, BLOCK ))
      if (!Vec_PtrSize( FTIMEEDGES( pObj ) ))
        Abc_FlowRetime_ConstrainExact( pObj );
}